

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainModel.cpp
# Opt level: O0

void __thiscall tiger::trains::models::TrainModel::TrainModel(TrainModel *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  std::vector<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
  ::vector((vector<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
            *)0x242d91);
  return;
}

Assistant:

TrainModel::TrainModel()
{
}